

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O0

bool __thiscall Planner::Detect_Collision(Planner *this,Vec3i coordinates_)

{
  bool local_51;
  __normal_iterator<Vec3i_*,_std::vector<Vec3i,_std::allocator<Vec3i>_>_> local_50;
  Vec3i *local_48;
  __normal_iterator<Vec3i_*,_std::vector<Vec3i,_std::allocator<Vec3i>_>_> local_40;
  __normal_iterator<Vec3i_*,_std::vector<Vec3i,_std::allocator<Vec3i>_>_> local_38;
  Planner *local_30;
  Planner *this_local;
  int local_20;
  undefined8 local_18;
  Vec3i coordinates__local;
  
  local_20 = coordinates_.z;
  this_local = coordinates_._0_8_;
  local_18._0_4_ = coordinates_.x;
  local_51 = true;
  if ((-1 < (int)local_18) && (local_51 = true, (int)local_18 < (this->World_Size).x)) {
    local_18._4_4_ = coordinates_.y;
    local_51 = true;
    if ((-1 < (long)this_local) &&
       (((local_51 = true, local_18._4_4_ < (this->World_Size).y && (local_51 = true, -1 < local_20)
         ) && (local_51 = true, local_20 < (this->World_Size).z)))) {
      local_30 = this;
      local_18 = this_local;
      coordinates__local.x = local_20;
      local_40._M_current = (Vec3i *)std::vector<Vec3i,_std::allocator<Vec3i>_>::begin(&this->walls)
      ;
      local_48 = (Vec3i *)std::vector<Vec3i,_std::allocator<Vec3i>_>::end(&this->walls);
      local_38 = std::
                 find<__gnu_cxx::__normal_iterator<Vec3i*,std::vector<Vec3i,std::allocator<Vec3i>>>,Vec3i>
                           (local_40,(__normal_iterator<Vec3i_*,_std::vector<Vec3i,_std::allocator<Vec3i>_>_>
                                      )local_48,(Vec3i *)&local_18);
      local_50._M_current = (Vec3i *)std::vector<Vec3i,_std::allocator<Vec3i>_>::end(&this->walls);
      local_51 = __gnu_cxx::operator!=(&local_38,&local_50);
    }
  }
  return local_51 != false;
}

Assistant:

bool Planner::Detect_Collision(Vec3i coordinates_) {
  if (coordinates_.x < 0 || coordinates_.x >= World_Size.x || coordinates_.y < 0
      || coordinates_.y >= World_Size.y || coordinates_.z < 0
      || coordinates_.z >= World_Size.z
      || std::find(walls.begin(), walls.end(), coordinates_) != walls.end()) {
    return true;  ///< return true of collision happens
  }
  return false;  ///< return false if collision doesn't happen
}